

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t driver::zeVirtualMemUnmap(ze_context_handle_t hContext,void *ptr,size_t size)

{
  ze_pfnVirtualMemUnmap_t pfnUnmap;
  ze_result_t result;
  size_t size_local;
  void *ptr_local;
  ze_context_handle_t hContext_local;
  
  pfnUnmap._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c740 != (code *)0x0) {
    pfnUnmap._4_4_ = (*DAT_0011c740)(hContext,ptr,size);
  }
  return pfnUnmap._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeVirtualMemUnmap(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        const void* ptr,                                ///< [in] pointer to start of region to unmap.
        size_t size                                     ///< [in] size in bytes to unmap; must be page aligned.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnUnmap = context.zeDdiTable.VirtualMem.pfnUnmap;
        if( nullptr != pfnUnmap )
        {
            result = pfnUnmap( hContext, ptr, size );
        }
        else
        {
            // generic implementation
        }

        return result;
    }